

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::findRecursively
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,
          ArrayRef<llvm::dwarf::Attribute> Attrs)

{
  size_t *this_00;
  DWARFDebugInfoEntry **V;
  pair<llvm::NoneType,_bool> pVar1;
  DWARFDebugInfoEntry *pDVar2;
  DWARFDebugInfoEntry *pDVar3;
  undefined1 local_d8 [8];
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> Seen;
  DWARFDie Die;
  DWARFDie D;
  vector<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_> Worklist;
  
  D.Die = (DWARFDebugInfoEntry *)0x0;
  std::vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>>::
  _M_realloc_insert<llvm::DWARFDie_const&>
            ((vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>> *)&D.Die,(iterator)0x0,this);
  local_d8 = (undefined1  [8])
             &Seen.Vector.super_SmallVectorImpl<llvm::DWARFDie>.
              super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
  Seen.Vector.super_SmallVectorImpl<llvm::DWARFDie>.
  super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX =
       (void *)0x300000000;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&Seen.Set;
  Seen.Set._M_t._M_impl._0_4_ = 0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       Seen.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
            ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,this);
  if (D.Die != (DWARFDebugInfoEntry *)0x0) {
    this_00 = &Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    V = &Die.Die;
    pDVar2 = D.Die;
    pDVar3 = (DWARFDebugInfoEntry *)0x0;
    do {
      Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)&pDVar3[-1].Depth;
      Die.U = (DWARFUnit *)pDVar3[-1].AbbrevDecl;
      Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&pDVar3[-1].Depth;
      if ((Seen.Set._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
         (Die.U != (DWARFUnit *)0x0)) {
        find(__return_storage_ptr__,(DWARFDie *)this_00,Attrs);
        if ((__return_storage_ptr__->Storage).hasVal == true) goto LAB_00d6d09d;
        join_0x00000010_0x00000000_ =
             getAttributeValueAsReferencedDie((DWARFDie *)this_00,DW_AT_abstract_origin);
        if ((Die._16_8_ != (DWARFDebugInfoEntry *)0x0 && Die.Die != (DWARFUnit *)0x0) &&
           (pVar1 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                              ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,
                               (DWARFDie *)V), ((ulong)pVar1 & 0x100000000) != 0)) {
          if (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>>::
            _M_realloc_insert<llvm::DWARFDie_const&>
                      ((vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>> *)&D.Die,(iterator)0x0
                       ,(DWARFDie *)V);
          }
          else {
            *(DWARFDebugInfoEntry **)
             Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
             super__Vector_impl_data._M_start = Die.Die;
            pDVar3[-1].AbbrevDecl = (DWARFAbbreviationDeclaration *)D.U;
            Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pDVar3;
          }
        }
        join_0x00000010_0x00000000_ =
             getAttributeValueAsReferencedDie((DWARFDie *)this_00,DW_AT_specification);
        pDVar2 = D.Die;
        if ((Die._16_8_ != (DWARFDebugInfoEntry *)0x0 && Die.Die != (DWARFUnit *)0x0) &&
           (pVar1 = SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
                              ((SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)local_d8,
                               (DWARFDie *)V), pDVar2 = D.Die, ((ulong)pVar1 & 0x100000000) != 0)) {
          if (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>>::
            _M_realloc_insert<llvm::DWARFDie_const&>
                      ((vector<llvm::DWARFDie,std::allocator<llvm::DWARFDie>> *)&D.Die,(iterator)0x0
                       ,(DWARFDie *)V);
            pDVar2 = D.Die;
          }
          else {
            (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
             super__Vector_impl_data._M_start)->U = (DWARFUnit *)Die.Die;
            (Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
             super__Vector_impl_data._M_start)->Die = (DWARFDebugInfoEntry *)D.U;
            Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
            super__Vector_impl_data._M_start =
                 Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      pDVar3 = (DWARFDebugInfoEntry *)
               Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (pDVar2 != (DWARFDebugInfoEntry *)
                       Worklist.super__Vector_base<llvm::DWARFDie,_std::allocator<llvm::DWARFDie>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
LAB_00d6d09d:
  std::
  _Rb_tree<llvm::DWARFDie,_llvm::DWARFDie,_std::_Identity<llvm::DWARFDie>,_std::less<llvm::DWARFDie>,_std::allocator<llvm::DWARFDie>_>
  ::~_Rb_tree((_Rb_tree<llvm::DWARFDie,_llvm::DWARFDie,_std::_Identity<llvm::DWARFDie>,_std::less<llvm::DWARFDie>,_std::allocator<llvm::DWARFDie>_>
               *)(Seen.Vector.super_SmallVectorStorage<llvm::DWARFDie,_3U>.InlineElts[2].buffer + 8)
             );
  if (local_d8 !=
      (undefined1  [8])
      &Seen.Vector.super_SmallVectorImpl<llvm::DWARFDie>.
       super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
       super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size) {
    free((void *)local_d8);
  }
  if (D.Die != (DWARFDebugInfoEntry *)0x0) {
    operator_delete(D.Die,-(long)D.Die);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
DWARFDie::findRecursively(ArrayRef<dwarf::Attribute> Attrs) const {
  std::vector<DWARFDie> Worklist;
  Worklist.push_back(*this);

  // Keep track if DIEs already seen to prevent infinite recursion.
  // Empirically we rarely see a depth of more than 3 when dealing with valid
  // DWARF. This corresponds to following the DW_AT_abstract_origin and
  // DW_AT_specification just once.
  SmallSet<DWARFDie, 3> Seen;
  Seen.insert(*this);

  while (!Worklist.empty()) {
    DWARFDie Die = Worklist.back();
    Worklist.pop_back();

    if (!Die.isValid())
      continue;

    if (auto Value = Die.find(Attrs))
      return Value;

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      if (Seen.insert(D).second)
        Worklist.push_back(D);

    if (auto D = Die.getAttributeValueAsReferencedDie(DW_AT_specification))
      if (Seen.insert(D).second)
        Worklist.push_back(D);
  }

  return None;
}